

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreDepth(Gia_ManAre_t *p,int iState)

{
  Gia_StaAre_t *pGVar1;
  Gia_StaAre_t *pS;
  int iVar2;
  
  pGVar1 = (Gia_StaAre_t *)*p->ppStas;
  iVar2 = 0;
  for (pS = (Gia_StaAre_t *)
            ((long)p->nSize * (ulong)(iState & 0xfffff) * 4 +
            *(long *)((long)p->ppStas + (ulong)((uint)iState >> 0x11 & 0x3ff8))); pGVar1 != pS;
      pS = Gia_StaPrev(p,pS)) {
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManAreDepth( Gia_ManAre_t * p, int iState )
{
    Gia_StaAre_t * pSta;
    int Counter = 0;
    for ( pSta = Gia_ManAreStaInt(p, iState); Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        Counter++;
    return Counter;
}